

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<pbrt::Token> * __thiscall
pbrt::Tokenizer::Next(optional<pbrt::Token> *__return_storage_ptr__,Tokenizer *this)

{
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  bool bVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  char *va;
  char *vb;
  FileLoc local_38;
  
  local_38.line = (this->loc).line;
  local_38.column = (this->loc).column;
  pbVar5 = (byte *)this->pos;
  pbVar2 = (byte *)this->end;
  local_38.filename._M_len = (this->loc).filename._M_len;
  local_38.filename._M_str = (this->loc).filename._M_str;
  if (pbVar5 != pbVar2) {
    iVar6 = (this->loc).line;
    iVar7 = (this->loc).column;
    pbVar13 = pbVar5;
    do {
      pbVar10 = pbVar13 + 1;
      this->pos = (char *)pbVar10;
      bVar1 = *pbVar13;
      if (bVar1 != 10) {
        iVar11 = iVar7 + 1;
        (this->loc).column = iVar11;
        if (bVar1 < 0x20) {
          if ((bVar1 == 9) || (bVar1 == 0xd)) goto LAB_0038fb89;
        }
        else if (bVar1 < 0x22) {
          if (bVar1 == 0x20) goto LAB_0038fb89;
        }
        else if (bVar1 < 0x5b) {
          if (bVar1 == 0x22) {
            if (pbVar13 + 1 == pbVar2) goto LAB_0038fced;
            bVar9 = false;
            pbVar10 = pbVar13 + 1;
            goto LAB_0038fc65;
          }
          if (bVar1 == 0x23) {
            iVar7 = iVar7 + 2;
            pbVar10 = pbVar13 + 1;
            goto LAB_0038fbf1;
          }
        }
        else {
          if ((bVar1 == 0x5b) || (bVar1 == 0x5d)) {
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_38._16_8_;
            *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
                 local_38.filename._M_len;
            *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) =
                 local_38.filename._M_str;
            __return_storage_ptr__->set = true;
            (__return_storage_ptr__->optionalValue).__align =
                 (anon_struct_8_0_00000001_for___align)0x1;
            goto LAB_0038fde6;
          }
          if (bVar1 == 0xff) break;
        }
        iVar7 = iVar7 + 2;
        pbVar10 = pbVar13 + 1;
        goto LAB_0038fd34;
      }
      iVar6 = iVar6 + 1;
      (this->loc).line = iVar6;
      (this->loc).column = 0;
      iVar11 = 0;
LAB_0038fb89:
      iVar7 = iVar11;
      local_38.line = (this->loc).line;
      local_38.column = (this->loc).column;
      pbVar5 = pbVar5 + 1;
      local_38.filename._M_len = (this->loc).filename._M_len;
      local_38.filename._M_str = (this->loc).filename._M_str;
      pbVar13 = pbVar10;
    } while (pbVar10 != pbVar2);
  }
  goto LAB_0038fba7;
LAB_0038fe29:
  if (*pbVar13 == 0x5c) {
    pbVar13 = pbVar13 + 1;
    vb = (char *)pbVar5;
    if (pbVar5 <= pbVar13) {
      va = (char *)pbVar13;
      LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],char_const*&,char_const(&)[4],char_const*&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parser.cpp"
                 ,0x11a,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0xa210b8,
                 (char (*) [4])"pos",(char (*) [2])0xa210b8,&va,(char (*) [4])"pos",&vb);
    }
    bVar1 = *pbVar13;
    va = (char *)CONCAT44((int)((ulong)pbVar13 >> 0x20),(int)(char)bVar1);
    if (bVar1 < 0x66) {
      if (bVar1 < 0x5c) {
        if ((bVar1 != 0x22) && (bVar1 != 0x27)) goto LAB_0038ff72;
      }
      else if ((bVar1 != 0x5c) && (bVar1 != 0x62)) goto LAB_0038ff72;
    }
    else if (bVar1 < 0x72) {
      if ((bVar1 != 0x66) && (bVar1 != 0x6e)) goto LAB_0038ff72;
    }
    else if ((bVar1 != 0x72) && (bVar1 != 0x74)) {
      if (bVar1 == 0xff) {
        ErrorExit(&local_38,"premature EOF after character escape \'\\\'");
      }
LAB_0038ff72:
      ErrorExit<int&>(&local_38,"unexpected escaped character \"%c\"",(int *)&va);
    }
  }
  std::__cxx11::string::push_back((char)this + 'x');
  pbVar5 = (byte *)this->pos;
  pbVar13 = pbVar13 + 1;
  if (pbVar5 <= pbVar13) {
LAB_0038fec5:
    pcVar3 = (this->sEscaped)._M_dataplus._M_p;
    aVar4 = (anon_struct_8_0_00000001_for___align)(this->sEscaped)._M_string_length;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_38._16_8_;
    *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_38.filename._M_len;
    *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_38.filename._M_str;
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align = aVar4;
    *(pointer *)((long)&__return_storage_ptr__->optionalValue + 8) = pcVar3;
    return __return_storage_ptr__;
  }
  goto LAB_0038fe29;
  while( true ) {
    pbVar10 = pbVar8 + 1;
    this->pos = (char *)pbVar10;
    bVar1 = *pbVar8;
    if (bVar1 == 10) goto LAB_0038fd88;
    (this->loc).column = iVar7;
    if (bVar1 == 0xff) goto LAB_0038fdc8;
    iVar7 = iVar7 + 1;
    if (bVar1 == 0xd) break;
LAB_0038fbf1:
    pbVar8 = pbVar10;
    pbVar10 = pbVar2;
    if (pbVar8 == pbVar2) goto LAB_0038fdc8;
  }
  goto LAB_0038fd7f;
LAB_0038fd88:
  (this->loc).line = iVar6 + 1;
  (this->loc).column = 0;
  goto LAB_0038fd97;
LAB_0038fc65:
  do {
    pbVar8 = pbVar10 + 1;
    this->pos = (char *)pbVar8;
    bVar1 = *pbVar10;
    if (bVar1 == 10) {
      va = "unterminated string";
      (this->loc).line = iVar6 + 1;
      (this->loc).column = 0;
      goto LAB_0038fcf4;
    }
    (this->loc).column = iVar11 + 1;
    if (bVar1 == 0x5c) {
      if (pbVar8 == pbVar2) break;
      pbVar8 = pbVar10 + 2;
      this->pos = (char *)pbVar8;
      bVar1 = pbVar10[1];
      if (bVar1 != 10) {
        bVar9 = true;
        (this->loc).column = iVar11 + 2;
        iVar11 = iVar11 + 2;
        goto joined_r0x0038fcdc;
      }
      iVar6 = iVar6 + 1;
      bVar9 = true;
      iVar11 = 0;
      (this->loc).line = iVar6;
      (this->loc).column = 0;
    }
    else {
      iVar11 = iVar11 + 1;
      if (bVar1 == 0x22) {
        if (!bVar9) {
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_38._16_8_;
          *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
               local_38.filename._M_len;
          *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_38.filename._M_str
          ;
          __return_storage_ptr__->set = true;
          (__return_storage_ptr__->optionalValue).__align =
               (anon_struct_8_0_00000001_for___align)((long)pbVar10 + (1 - (long)pbVar5));
          goto LAB_0038fde6;
        }
        (this->sEscaped)._M_string_length = 0;
        *(this->sEscaped)._M_dataplus._M_p = '\0';
        pbVar5 = (byte *)this->pos;
        if (pbVar5 <= pbVar13) goto LAB_0038fec5;
        goto LAB_0038fe29;
      }
joined_r0x0038fcdc:
      if (bVar1 == 0xff) break;
    }
    pbVar10 = pbVar8;
  } while (pbVar8 != pbVar2);
LAB_0038fced:
  va = "premature EOF";
LAB_0038fcf4:
  vb = (char *)&local_38;
  if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->errorCallback)._M_invoker)((_Any_data *)&this->errorCallback,&va,(FileLoc **)&vb);
LAB_0038fba7:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  return __return_storage_ptr__;
  while( true ) {
    if (uVar12 == 0x5b) break;
    if (uVar12 == 0xff) goto LAB_0038fdc8;
    if (bVar1 == 0x5d) break;
LAB_0038fd34:
    pbVar8 = pbVar10;
    pbVar10 = pbVar2;
    if (pbVar8 == pbVar2) goto LAB_0038fdc8;
    pbVar10 = pbVar8 + 1;
    this->pos = (char *)pbVar10;
    bVar1 = *pbVar8;
    if (bVar1 == 10) goto LAB_0038fd88;
    (this->loc).column = iVar7;
    iVar7 = iVar7 + 1;
    uVar12 = (uint)bVar1;
    if (bVar1 < 0x5b) {
      if ((bVar1 < 0x23) && ((0x500002200U >> ((ulong)uVar12 & 0x3f) & 1) != 0)) break;
      goto LAB_0038fd34;
    }
  }
LAB_0038fd7f:
  iVar6 = iVar6 + -1;
LAB_0038fd97:
  this->pos = (char *)pbVar8;
  pbVar10 = pbVar8;
  if (*pbVar8 == 10) {
    (this->loc).line = iVar6;
  }
LAB_0038fdc8:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_38._16_8_;
  *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_38.filename._M_len;
  *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_38.filename._M_str;
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)((long)pbVar10 - (long)pbVar5);
LAB_0038fde6:
  *(byte **)((long)&__return_storage_ptr__->optionalValue + 8) = pbVar13;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<Token> Tokenizer::Next() {
    while (true) {
        const char *tokenStart = pos;
        FileLoc startLoc = loc;

        int ch = getChar();
        if (ch == EOF)
            return {};
        else if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r') {
            // nothing
        } else if (ch == '"') {
            // scan to closing quote
            bool haveEscaped = false;
            while ((ch = getChar()) != '"') {
                if (ch == EOF) {
                    errorCallback("premature EOF", &startLoc);
                    return {};
                } else if (ch == '\n') {
                    errorCallback("unterminated string", &startLoc);
                    return {};
                } else if (ch == '\\') {
                    haveEscaped = true;
                    // Grab the next character
                    if ((ch = getChar()) == EOF) {
                        errorCallback("premature EOF", &startLoc);
                        return {};
                    }
                }
            }

            if (!haveEscaped)
                return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
            else {
                sEscaped.clear();
                for (const char *p = tokenStart; p < pos; ++p) {
                    if (*p != '\\')
                        sEscaped.push_back(*p);
                    else {
                        ++p;
                        CHECK_LT(p, pos);
                        sEscaped.push_back(decodeEscaped(*p, startLoc));
                    }
                }
                return Token({sEscaped.data(), sEscaped.size()}, startLoc);
            }
        } else if (ch == '[' || ch == ']') {
            return Token({tokenStart, size_t(1)}, startLoc);
        } else if (ch == '#') {
            // comment: scan to EOL (or EOF)
            while ((ch = getChar()) != EOF) {
                if (ch == '\n' || ch == '\r') {
                    ungetChar();
                    break;
                }
            }

            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        } else {
            // Regular statement or numeric token; scan until we hit a
            // space, opening quote, or bracket.
            while ((ch = getChar()) != EOF) {
                if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r' || ch == '"' ||
                    ch == '[' || ch == ']') {
                    ungetChar();
                    break;
                }
            }
            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        }
    }
}